

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

DescriptorKeyInfo * __thiscall
cfd::core::DescriptorKeyInfo::operator=(DescriptorKeyInfo *this,DescriptorKeyInfo *object)

{
  if (this != object) {
    this->key_type_ = object->key_type_;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->pubkey_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->schnorr_pubkey_);
    Privkey::operator=(&this->privkey_,&object->privkey_);
    ExtPrivkey::operator=(&this->extprivkey_,&object->extprivkey_);
    ExtPubkey::operator=(&this->extpubkey_,&object->extpubkey_);
    ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
    ::std::__cxx11::string::_M_assign((string *)&this->path_);
    ::std::__cxx11::string::_M_assign((string *)&this->key_string_);
  }
  return this;
}

Assistant:

DescriptorKeyInfo& DescriptorKeyInfo::operator=(
    const DescriptorKeyInfo& object) {
  if (this != &object) {
    key_type_ = object.key_type_;
    pubkey_ = object.pubkey_;
    schnorr_pubkey_ = object.schnorr_pubkey_;
    privkey_ = object.privkey_;
    extprivkey_ = object.extprivkey_;
    extpubkey_ = object.extpubkey_;
    parent_info_ = object.parent_info_;
    path_ = object.path_;
    key_string_ = object.key_string_;
  }
  return *this;
}